

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URI.cpp
# Opt level: O3

String * __thiscall
stick::URI::decode(String *__return_storage_ptr__,URI *this,String *_str,Error *_error)

{
  ulong uVar1;
  char cVar2;
  char cVar3;
  Allocator *pAVar4;
  Size SVar5;
  ErrorCategory *__dest;
  ulong uVar6;
  DefaultAllocator *pDVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  undefined4 extraout_var;
  ErrorCategory *pEVar11;
  int *piVar12;
  long lVar13;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  String *pSVar14;
  char *pcVar15;
  ErrorCategory *pEVar16;
  UInt32 _line;
  char *pcVar17;
  String local_c8;
  Error local_a8;
  char *local_50;
  long local_48;
  Error *local_40;
  String *local_38;
  undefined4 extraout_var_00;
  char *pcVar18;
  
  local_40 = _error;
  local_38 = __return_storage_ptr__;
  if (defaultAllocator()::m_def == '\0') {
    decode();
  }
  pDVar7 = defaultAllocator::m_def;
  local_38->m_length = 0;
  local_38->m_allocator = &pDVar7->super_Allocator;
  iVar9 = (*(pDVar7->super_Allocator)._vptr_Allocator[2])(pDVar7,0x81,1);
  local_38->m_cStr = (char *)CONCAT44(extraout_var,iVar9);
  memset((char *)CONCAT44(extraout_var,iVar9),0,0x81);
  local_38->m_capacity = 0x80;
  pSVar14 = local_38;
  if (_str->m_length != 0) {
    pcVar17 = _str->m_cStr;
    pcVar15 = pcVar17 + _str->m_length;
    bVar8 = false;
    do {
      cVar2 = *pcVar17;
      if (cVar2 == '%') {
        if (pcVar17 + 1 == pcVar15) {
          if (defaultAllocator()::m_def == '\0') {
            decode();
          }
          local_c8.m_allocator = &defaultAllocator::m_def->super_Allocator;
          iVar9 = (*(defaultAllocator::m_def->super_Allocator)._vptr_Allocator[2])
                            (defaultAllocator::m_def,0x30,1);
          local_c8.m_cStr = (char *)CONCAT44(extraout_var_05,iVar9);
          builtin_strncpy(local_c8.m_cStr,"Two hex digits have to follow the percent sign!",0x30);
          _line = 0x138;
LAB_0011ab10:
          local_c8.m_capacity = 0x2f;
          local_c8.m_length = 0x2f;
          stick::Error::Error<stick::ec::MiscErrorCode>
                    (&local_a8,BadURI,&local_c8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/URI.cpp"
                     ,_line,(type *)0x0);
          local_40->m_code = local_a8.m_code;
          local_40->m_category = local_a8.m_category;
          local_50 = (local_40->m_message).m_cStr;
          if (local_50 != (char *)0x0) {
            local_48 = (local_40->m_message).m_capacity + 1;
            (*((local_40->m_message).m_allocator)->_vptr_Allocator[3])();
          }
          (local_40->m_message).m_cStr = local_a8.m_message.m_cStr;
          (local_40->m_message).m_allocator = local_a8.m_message.m_allocator;
          (local_40->m_message).m_length = local_a8.m_message.m_length;
          (local_40->m_message).m_capacity = local_a8.m_message.m_capacity;
          local_a8.m_message.m_cStr = (char *)0x0;
          local_50 = (local_40->m_file).m_cStr;
          if (local_50 != (char *)0x0) {
            local_48 = (local_40->m_file).m_capacity + 1;
            (*((local_40->m_file).m_allocator)->_vptr_Allocator[3])();
          }
          (local_40->m_file).m_cStr = local_a8.m_file.m_cStr;
          (local_40->m_file).m_allocator = local_a8.m_file.m_allocator;
          (local_40->m_file).m_length = local_a8.m_file.m_length;
          (local_40->m_file).m_capacity = local_a8.m_file.m_capacity;
          local_a8.m_file.m_cStr = (char *)0x0;
          local_40->m_line = local_a8.m_line;
          if (local_a8.m_message.m_cStr != (char *)0x0) {
            local_48 = local_a8.m_message.m_capacity + 1;
            local_50 = local_a8.m_message.m_cStr;
            (*(local_a8.m_message.m_allocator)->_vptr_Allocator[3])();
            local_a8.m_message.m_cStr = (char *)0x0;
            local_a8.m_message.m_length = 0;
            local_a8.m_message.m_capacity = 0;
          }
          if (local_c8.m_cStr == (char *)0x0) {
            return local_38;
          }
          local_48 = local_c8.m_capacity + 1;
          local_50 = local_c8.m_cStr;
          (*((Allocator *)&(local_c8.m_allocator)->_vptr_Allocator)->_vptr_Allocator[3])();
          return local_38;
        }
        pcVar18 = pcVar17 + 2;
        if (pcVar18 == pcVar15) {
          if (defaultAllocator()::m_def == '\0') {
            decode();
          }
          local_c8.m_allocator = &defaultAllocator::m_def->super_Allocator;
          iVar9 = (*(defaultAllocator::m_def->super_Allocator)._vptr_Allocator[2])
                            (defaultAllocator::m_def,0x30,1);
          local_c8.m_cStr = (char *)CONCAT44(extraout_var_06,iVar9);
          builtin_strncpy(local_c8.m_cStr,"Two hex digits have to follow the percent sign!",0x30);
          _line = 0x144;
          goto LAB_0011ab10;
        }
        cVar2 = pcVar17[1];
        cVar3 = *pcVar18;
        iVar9 = isxdigit((int)cVar2);
        if ((iVar9 == 0) || (iVar9 = isxdigit((int)cVar3), iVar9 == 0)) {
          if (defaultAllocator()::m_def == '\0') {
            decode();
          }
          local_c8.m_allocator = &defaultAllocator::m_def->super_Allocator;
          iVar9 = (*(defaultAllocator::m_def->super_Allocator)._vptr_Allocator[2])
                            (defaultAllocator::m_def,0x30,1);
          local_c8.m_cStr = (char *)CONCAT44(extraout_var_04,iVar9);
          builtin_strncpy(local_c8.m_cStr,"The high or low digit is not a valid hex digit!",0x30);
          _line = 0x14f;
          goto LAB_0011ab10;
        }
        if (defaultAllocator()::m_def == '\0') {
          decode();
        }
        pDVar7 = defaultAllocator::m_def;
        iVar9 = (*(defaultAllocator::m_def->super_Allocator)._vptr_Allocator[2])
                          (defaultAllocator::m_def,3,1);
        pEVar11 = (ErrorCategory *)CONCAT44(extraout_var_00,iVar9);
        *(char *)((long)&pEVar11->_vptr_ErrorCategory + 2) = '\0';
        *(char *)&pEVar11->_vptr_ErrorCategory = cVar2;
        *(char *)((long)&pEVar11->_vptr_ErrorCategory + 1) = cVar3;
        piVar12 = __errno_location();
        *piVar12 = 0;
        lVar13 = strtol((char *)pEVar11,(char **)0x0,0x10);
        iVar9 = *piVar12;
        if (iVar9 == 0) {
          SVar5 = local_38->m_length;
          uVar1 = SVar5 + 1;
          if (local_38->m_capacity < uVar1) {
            uVar6 = uVar1 * 2;
            pEVar16 = (ErrorCategory *)local_38->m_cStr;
            if (local_38->m_capacity < uVar6) {
              iVar10 = (*local_38->m_allocator->_vptr_Allocator[2])
                                 (local_38->m_allocator,uVar6 | 1,1);
              local_38->m_cStr = (char *)CONCAT44(extraout_var_03,iVar10);
              memset((char *)CONCAT44(extraout_var_03,iVar10),0,uVar6 | 1);
              __dest = (ErrorCategory *)local_38->m_cStr;
              if (__dest == (ErrorCategory *)0x0) goto LAB_0011acab;
              if (pEVar16 != (ErrorCategory *)0x0) {
                strcpy((char *)__dest,(char *)pEVar16);
                local_a8._8_8_ = local_38->m_capacity + 1;
                local_a8.m_category = pEVar16;
                (*local_38->m_allocator->_vptr_Allocator[3])(local_38->m_allocator,&local_a8);
              }
              local_38->m_capacity = uVar6;
              pEVar16 = __dest;
            }
          }
          else {
            pEVar16 = (ErrorCategory *)local_38->m_cStr;
          }
          local_38->m_length = uVar1;
          *(char *)((long)&pEVar16->_vptr_ErrorCategory + SVar5) = (char)lVar13;
        }
        else {
          if (defaultAllocator()::m_def == '\0') {
            decode();
          }
          local_c8.m_cStr = (char *)0x0;
          local_c8.m_length = 0;
          local_c8.m_capacity = 0;
          local_c8.m_allocator = &defaultAllocator::m_def->super_Allocator;
          iVar10 = (*(defaultAllocator::m_def->super_Allocator)._vptr_Allocator[2])
                             (defaultAllocator::m_def,0x27,1);
          local_c8.m_cStr = (char *)CONCAT44(extraout_var_01,iVar10);
          local_c8.m_capacity = 0x26;
          local_c8.m_length = 0x26;
          builtin_strncpy(local_c8.m_cStr,"Error extracting char from hex digits!",0x27);
          stick::Error::Error<stick::ec::MiscErrorCode>
                    (&local_a8,BadURI,&local_c8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/URI.cpp"
                     ,0x159,(type *)0x0);
          local_40->m_code = local_a8.m_code;
          local_40->m_category = local_a8.m_category;
          pcVar17 = (local_40->m_message).m_cStr;
          if (pcVar17 != (char *)0x0) {
            pAVar4 = (local_40->m_message).m_allocator;
            local_48 = (local_40->m_message).m_capacity + 1;
            local_50 = pcVar17;
            (*pAVar4->_vptr_Allocator[3])(pAVar4,&local_50);
          }
          (local_40->m_message).m_cStr = local_a8.m_message.m_cStr;
          (local_40->m_message).m_allocator = local_a8.m_message.m_allocator;
          (local_40->m_message).m_length = local_a8.m_message.m_length;
          (local_40->m_message).m_capacity = local_a8.m_message.m_capacity;
          local_a8.m_message.m_cStr = (char *)0x0;
          pcVar17 = (local_40->m_file).m_cStr;
          if (pcVar17 != (char *)0x0) {
            pAVar4 = (local_40->m_file).m_allocator;
            local_48 = (local_40->m_file).m_capacity + 1;
            local_50 = pcVar17;
            (*pAVar4->_vptr_Allocator[3])(pAVar4,&local_50);
          }
          (local_40->m_file).m_cStr = local_a8.m_file.m_cStr;
          (local_40->m_file).m_allocator = local_a8.m_file.m_allocator;
          (local_40->m_file).m_length = local_a8.m_file.m_length;
          (local_40->m_file).m_capacity = local_a8.m_file.m_capacity;
          local_a8.m_file.m_cStr = (char *)0x0;
          local_40->m_line = local_a8.m_line;
          if (local_a8.m_message.m_cStr != (char *)0x0) {
            local_48 = local_a8.m_message.m_capacity + 1;
            local_50 = local_a8.m_message.m_cStr;
            (*(local_a8.m_message.m_allocator)->_vptr_Allocator[3])
                      (local_a8.m_message.m_allocator,&local_50);
            local_a8.m_message.m_cStr = (char *)0x0;
            local_a8.m_message.m_length = 0;
            local_a8.m_message.m_capacity = 0;
          }
          if (local_c8.m_cStr != (char *)0x0) {
            local_48 = local_c8.m_capacity + 1;
            local_50 = local_c8.m_cStr;
            (*((Allocator *)&(local_c8.m_allocator)->_vptr_Allocator)->_vptr_Allocator[3])
                      (local_c8.m_allocator,&local_50);
          }
          bVar8 = true;
        }
        local_a8._8_8_ = 3;
        local_a8.m_category = pEVar11;
        (*(pDVar7->super_Allocator)._vptr_Allocator[3])(pDVar7,&local_a8);
        pSVar14 = local_38;
        if (iVar9 != 0) {
          if (bVar8) {
            return local_38;
          }
          local_a8.m_category = (ErrorCategory *)local_38->m_cStr;
          if (local_a8.m_category == (ErrorCategory *)0x0) {
            return local_38;
          }
          local_a8._8_8_ = local_38->m_capacity + 1;
          (*local_38->m_allocator->_vptr_Allocator[3])();
          local_38->m_cStr = (char *)0x0;
          local_38->m_length = 0;
          local_38->m_capacity = 0;
          return local_38;
        }
      }
      else {
        SVar5 = pSVar14->m_length;
        uVar1 = SVar5 + 1;
        if (pSVar14->m_capacity < uVar1) {
          uVar6 = uVar1 * 2;
          pEVar11 = (ErrorCategory *)pSVar14->m_cStr;
          if (pSVar14->m_capacity < uVar6) {
            iVar9 = (*pSVar14->m_allocator->_vptr_Allocator[2])(pSVar14->m_allocator,uVar6 | 1,1);
            local_38->m_cStr = (char *)CONCAT44(extraout_var_02,iVar9);
            memset((char *)CONCAT44(extraout_var_02,iVar9),0,uVar6 | 1);
            pEVar16 = (ErrorCategory *)local_38->m_cStr;
            if (pEVar16 == (ErrorCategory *)0x0) {
LAB_0011acab:
              __assert_fail("m_cStr != nullptr",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/String.hpp"
                            ,0x1a0,"void stick::String::reserve(Size)");
            }
            if (pEVar11 != (ErrorCategory *)0x0) {
              strcpy((char *)pEVar16,(char *)pEVar11);
              local_a8._8_8_ = local_38->m_capacity + 1;
              local_a8.m_category = pEVar11;
              (*local_38->m_allocator->_vptr_Allocator[3])(local_38->m_allocator,&local_a8);
            }
            local_38->m_capacity = uVar6;
            pSVar14 = local_38;
            pEVar11 = pEVar16;
          }
        }
        else {
          pEVar11 = (ErrorCategory *)pSVar14->m_cStr;
        }
        pSVar14->m_length = uVar1;
        *(char *)((long)&pEVar11->_vptr_ErrorCategory + SVar5) = cVar2;
        pcVar18 = pcVar17;
      }
      pcVar17 = pcVar18 + 1;
      pcVar15 = _str->m_cStr + _str->m_length;
    } while (pcVar17 != pcVar15);
  }
  return pSVar14;
}

Assistant:

String URI::decode(const String & _str, Error & _error) const
{
    String ret;
    ret.reserve(128);
    String::ConstIter it = _str.begin();
    for (; it != _str.end(); ++it)
    {
        char c = *it;
        Int64 tmp;
        if (c == '%')
        {
            // std::stringstream strstr;
            it++;
            if (it == _str.end())
            {
                _error = Error(ec::BadURI,
                               "Two hex digits have to follow the percent sign!",
                               STICK_FILE,
                               STICK_LINE);
                return ret;
            }

            char hi = *it;
            it++;

            if (it == _str.end())
            {
                _error = Error(ec::BadURI,
                               "Two hex digits have to follow the percent sign!",
                               STICK_FILE,
                               STICK_LINE);
                return ret;
            }

            char lo = *it;

            if (!isxdigit(hi) || !isxdigit(lo))
            {
                _error = Error(ec::BadURI,
                               "The high or low digit is not a valid hex digit!",
                               STICK_FILE,
                               STICK_LINE);
                return ret;
            }

            String tmp2 = String::concat(hi, lo);
            errno = 0;
            tmp = strtol(tmp2.cString(), NULL, 16);
            if (errno != 0)
            {
                _error = Error(
                    ec::BadURI, "Error extracting char from hex digits!", STICK_FILE, STICK_LINE);
                return ret;
            }
            ret.append((char)tmp);
        }
        else
        {
            ret.append(*it);
        }
    }

    return ret;
}